

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Node<DomButtonGroup_const*,QString>::emplaceValue<QString_const&>
          (Node<DomButtonGroup_const*,QString> *this,QString *args)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  QArrayData *pQVar4;
  
  pDVar1 = (args->d).d;
  pcVar2 = (args->d).ptr;
  qVar3 = (args->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pQVar4 = *(QArrayData **)(this + 8);
  *(Data **)(this + 8) = pDVar1;
  *(char16_t **)(this + 0x10) = pcVar2;
  *(qsizetype *)(this + 0x18) = qVar3;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }